

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btVector3.h
# Opt level: O1

btScalar calcRollingFriction(btWheelContactPoint *contactPoint)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  btRigidBody *pbVar6;
  btRigidBody *pbVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar15 = (contactPoint->m_frictionPositionWorld).m_floats[0];
  fVar13 = (contactPoint->m_frictionPositionWorld).m_floats[1];
  fVar10 = (contactPoint->m_frictionPositionWorld).m_floats[2];
  pbVar6 = contactPoint->m_body0;
  pbVar7 = contactPoint->m_body1;
  fVar1 = contactPoint->m_maxImpulse;
  fVar14 = fVar15 - (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
  fVar15 = fVar15 - (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[0];
  fVar11 = fVar13 - (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
  fVar13 = fVar13 - (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[1];
  fVar12 = (pbVar7->m_angularVelocity).m_floats[1];
  fVar9 = (pbVar6->m_angularVelocity).m_floats[1];
  fVar2 = (pbVar7->m_angularVelocity).m_floats[0];
  fVar3 = (pbVar6->m_angularVelocity).m_floats[0];
  fVar4 = (pbVar7->m_angularVelocity).m_floats[2];
  fVar5 = (pbVar6->m_angularVelocity).m_floats[2];
  fVar8 = fVar10 - (pbVar6->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  fVar10 = fVar10 - (pbVar7->super_btCollisionObject).m_worldTransform.m_origin.m_floats[2];
  fVar9 = -((((pbVar6->m_linearVelocity).m_floats[2] + (fVar3 * fVar11 - fVar14 * fVar9)) -
            ((pbVar7->m_linearVelocity).m_floats[2] + (fVar2 * fVar13 - fVar15 * fVar12))) *
            (contactPoint->m_frictionDirectionWorld).m_floats[2] +
           (((fVar9 * fVar8 - fVar11 * fVar5) + (pbVar6->m_linearVelocity).m_floats[0]) -
           ((fVar12 * fVar10 - fVar13 * fVar4) + (pbVar7->m_linearVelocity).m_floats[0])) *
           (contactPoint->m_frictionDirectionWorld).m_floats[0] +
           (((pbVar6->m_linearVelocity).m_floats[1] + (fVar5 * fVar14 - fVar8 * fVar3)) -
           ((pbVar7->m_linearVelocity).m_floats[1] + (fVar4 * fVar15 - fVar10 * fVar2))) *
           (contactPoint->m_frictionDirectionWorld).m_floats[1]) * contactPoint->m_jacDiagABInv;
  fVar12 = fVar1;
  if (fVar9 <= fVar1) {
    fVar12 = fVar9;
  }
  fVar9 = -fVar1;
  if (-fVar1 <= fVar12) {
    fVar9 = fVar12;
  }
  return fVar9;
}

Assistant:

SIMD_FORCE_INLINE btVector3
operator-(const btVector3& v1, const btVector3& v2)
{
#if defined BT_USE_SIMD_VECTOR3 && (defined(BT_USE_SSE_IN_API)  && defined(BT_USE_SSE))

	//	without _mm_and_ps this code causes slowdown in Concave moving
	__m128 r = _mm_sub_ps(v1.mVec128, v2.mVec128);
	return btVector3(_mm_and_ps(r, btvFFF0fMask));
#elif defined(BT_USE_NEON)
	float32x4_t r = vsubq_f32(v1.mVec128, v2.mVec128);
	return btVector3((float32x4_t)vandq_s32((int32x4_t)r, btvFFF0Mask));
#else
	return btVector3(
			v1.m_floats[0] - v2.m_floats[0],
			v1.m_floats[1] - v2.m_floats[1],
			v1.m_floats[2] - v2.m_floats[2]);
#endif
}